

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVector.cpp
# Opt level: O0

void __thiscall HVector::clear(HVector *this)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  int *in_RDI;
  int i;
  int clearVector_inDense;
  size_type in_stack_ffffffffffffffc8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffd0;
  vector<double,_std::allocator<double>_> *this_00;
  int local_1c;
  
  bVar1 = true;
  if (-1 < in_RDI[1]) {
    bVar1 = (double)*in_RDI * 0.3 < (double)in_RDI[1];
  }
  if (bVar1) {
    std::vector<double,_std::allocator<double>_>::assign
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(value_type_conflict1 *)0x18c7ea)
    ;
  }
  else {
    for (local_1c = 0; local_1c < in_RDI[1]; local_1c = local_1c + 1) {
      this_00 = (vector<double,_std::allocator<double>_> *)(in_RDI + 8);
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)local_1c);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)*pvVar2);
      *pvVar3 = 0.0;
    }
  }
  *(undefined1 *)(in_RDI + 0x20) = 0;
  in_RDI[1] = 0;
  in_RDI[0xe] = 0;
  in_RDI[0x10] = 0;
  in_RDI[0x11] = 0;
  in_RDI[0x1e] = 0;
  in_RDI[0x1f] = 0;
  return;
}

Assistant:

void HVector::clear() {
    int clearVector_inDense = count < 0 || count > size * 0.3;
    if (clearVector_inDense) {
        array.assign(size, 0);
    } else {
        for (int i = 0; i < count; i++)
            array[index[i]] = 0;
    }
    packFlag = false;
    count = 0;
    pseudoTick = 0;
    fakeTick = 0;
    next = 0;
}